

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integrators.cpp
# Opt level: O3

unique_ptr<pbrt::Integrator,_std::default_delete<pbrt::Integrator>_> __thiscall
pbrt::Integrator::Create
          (Integrator *this,string *name,ParameterDictionary *parameters,CameraHandle *camera,
          SamplerHandle *sampler,PrimitiveHandle *aggregate,
          vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> *lights,
          RGBColorSpace *colorSpace,FileLoc *loc)

{
  vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> lights_00;
  int iVar1;
  char *fmt;
  undefined8 in_stack_fffffffffffffde0;
  polymorphic_allocator<pbrt::ParsedParameter_*> in_stack_fffffffffffffde8;
  undefined1 local_208 [32];
  PrimitiveHandle local_1e8;
  FileLoc local_1e0;
  vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> local_1c8;
  undefined1 local_1b0 [16];
  TaggedPointer<pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::RandomSampler,_pbrt::SobolSampler,_pbrt::StratifiedSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
  local_1a0;
  undefined1 local_198 [24];
  TaggedPointer<pbrt::UniformLightSampler,_pbrt::PowerLightSampler,_pbrt::BVHLightSampler,_pbrt::ExhaustiveLightSampler>
  local_180;
  undefined1 local_178 [32];
  ParsedParameter *local_158;
  TaggedPointer<pbrt::SimplePrimitive,_pbrt::GeometricPrimitive,_pbrt::TransformedPrimitive,_pbrt::AnimatedPrimitive,_pbrt::BVHAggregate,_pbrt::KdTreeAggregate>
  local_150;
  TaggedPointer<pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::RandomSampler,_pbrt::SobolSampler,_pbrt::StratifiedSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
  local_148;
  TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
  local_140;
  undefined1 local_138 [24];
  vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> local_120;
  undefined1 local_108 [24];
  vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> local_f0;
  undefined1 local_d8 [24];
  vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> local_c0;
  undefined1 local_a8 [24];
  vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> local_90;
  undefined1 local_78 [24];
  vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> local_60;
  vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> local_48;
  
  this->_vptr_Integrator = (_func_int **)0x0;
  iVar1 = std::__cxx11::string::compare((char *)name);
  if (iVar1 == 0) {
    local_60.super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (pointer)(camera->
                  super_TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
                  ).bits;
    local_60.super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>._M_impl.
    super__Vector_impl_data._M_finish =
         (pointer)(sampler->
                  super_TaggedPointer<pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::RandomSampler,_pbrt::SobolSampler,_pbrt::StratifiedSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
                  ).bits;
    local_60.super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)(aggregate->
                  super_TaggedPointer<pbrt::SimplePrimitive,_pbrt::GeometricPrimitive,_pbrt::TransformedPrimitive,_pbrt::AnimatedPrimitive,_pbrt::BVHAggregate,_pbrt::KdTreeAggregate>
                  ).bits;
    std::vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>::vector
              ((vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> *)local_78,lights);
    PathIntegrator::Create
              ((ParameterDictionary *)&stack0xfffffffffffffde8,(CameraHandle *)parameters,
               (SamplerHandle *)
               &local_60.super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,
               (PrimitiveHandle *)
               &local_60.super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>.
                _M_impl.super__Vector_impl_data._M_finish,&local_60,(FileLoc *)local_78);
    this->_vptr_Integrator = (_func_int **)in_stack_fffffffffffffde8.memoryResource;
    local_d8._0_8_ = local_78._0_8_;
    local_d8._16_8_ = local_78._16_8_;
  }
  else {
    iVar1 = std::__cxx11::string::compare((char *)name);
    if (iVar1 == 0) {
      local_90.super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           (pointer)(camera->
                    super_TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
                    ).bits;
      local_90.super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>._M_impl.
      super__Vector_impl_data._M_finish =
           (pointer)(sampler->
                    super_TaggedPointer<pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::RandomSampler,_pbrt::SobolSampler,_pbrt::StratifiedSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
                    ).bits;
      local_90.super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)(aggregate->
                    super_TaggedPointer<pbrt::SimplePrimitive,_pbrt::GeometricPrimitive,_pbrt::TransformedPrimitive,_pbrt::AnimatedPrimitive,_pbrt::BVHAggregate,_pbrt::KdTreeAggregate>
                    ).bits;
      std::vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>::vector
                ((vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> *)local_a8,lights);
      SimplePathIntegrator::Create
                ((ParameterDictionary *)&stack0xfffffffffffffde8,(CameraHandle *)parameters,
                 (SamplerHandle *)
                 &local_90.super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,
                 (PrimitiveHandle *)
                 &local_90.super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>
                  ._M_impl.super__Vector_impl_data._M_finish,&local_90,(FileLoc *)local_a8);
      this->_vptr_Integrator = (_func_int **)in_stack_fffffffffffffde8.memoryResource;
      local_d8._0_8_ = local_a8._0_8_;
      local_d8._16_8_ = local_a8._16_8_;
    }
    else {
      iVar1 = std::__cxx11::string::compare((char *)name);
      if (iVar1 == 0) {
        local_c0.super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             (pointer)(camera->
                      super_TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
                      ).bits;
        local_c0.super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>._M_impl.
        super__Vector_impl_data._M_finish =
             (pointer)(sampler->
                      super_TaggedPointer<pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::RandomSampler,_pbrt::SobolSampler,_pbrt::StratifiedSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
                      ).bits;
        local_c0.super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)(aggregate->
                      super_TaggedPointer<pbrt::SimplePrimitive,_pbrt::GeometricPrimitive,_pbrt::TransformedPrimitive,_pbrt::AnimatedPrimitive,_pbrt::BVHAggregate,_pbrt::KdTreeAggregate>
                      ).bits;
        std::vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>::vector
                  ((vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> *)local_d8,lights)
        ;
        LightPathIntegrator::Create
                  ((ParameterDictionary *)&stack0xfffffffffffffde8,(CameraHandle *)parameters,
                   (SamplerHandle *)
                   &local_c0.
                    super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage,
                   (PrimitiveHandle *)
                   &local_c0.
                    super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>.
                    _M_impl.super__Vector_impl_data._M_finish,&local_c0,(FileLoc *)local_d8);
        this->_vptr_Integrator = (_func_int **)in_stack_fffffffffffffde8.memoryResource;
      }
      else {
        iVar1 = std::__cxx11::string::compare((char *)name);
        if (iVar1 == 0) {
          local_f0.super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>._M_impl
          .super__Vector_impl_data._M_end_of_storage =
               (pointer)(camera->
                        super_TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
                        ).bits;
          local_f0.super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>._M_impl
          .super__Vector_impl_data._M_finish =
               (pointer)(sampler->
                        super_TaggedPointer<pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::RandomSampler,_pbrt::SobolSampler,_pbrt::StratifiedSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
                        ).bits;
          local_f0.super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>._M_impl
          .super__Vector_impl_data._M_start =
               (pointer)(aggregate->
                        super_TaggedPointer<pbrt::SimplePrimitive,_pbrt::GeometricPrimitive,_pbrt::TransformedPrimitive,_pbrt::AnimatedPrimitive,_pbrt::BVHAggregate,_pbrt::KdTreeAggregate>
                        ).bits;
          std::vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>::vector
                    ((vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> *)local_108,
                     lights);
          SimpleVolPathIntegrator::Create
                    ((ParameterDictionary *)&stack0xfffffffffffffde8,(CameraHandle *)parameters,
                     (SamplerHandle *)
                     &local_f0.
                      super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage,
                     (PrimitiveHandle *)
                     &local_f0.
                      super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>.
                      _M_impl.super__Vector_impl_data._M_finish,&local_f0,(FileLoc *)local_108);
          this->_vptr_Integrator = (_func_int **)in_stack_fffffffffffffde8.memoryResource;
          local_d8._0_8_ = local_108._0_8_;
          local_d8._16_8_ = local_108._16_8_;
        }
        else {
          iVar1 = std::__cxx11::string::compare((char *)name);
          if (iVar1 == 0) {
            local_120.super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage =
                 (pointer)(camera->
                          super_TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
                          ).bits;
            local_120.super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>.
            _M_impl.super__Vector_impl_data._M_finish =
                 (pointer)(sampler->
                          super_TaggedPointer<pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::RandomSampler,_pbrt::SobolSampler,_pbrt::StratifiedSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
                          ).bits;
            local_120.super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>.
            _M_impl.super__Vector_impl_data._M_start =
                 (pointer)(aggregate->
                          super_TaggedPointer<pbrt::SimplePrimitive,_pbrt::GeometricPrimitive,_pbrt::TransformedPrimitive,_pbrt::AnimatedPrimitive,_pbrt::BVHAggregate,_pbrt::KdTreeAggregate>
                          ).bits;
            std::vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>::vector
                      ((vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> *)local_138,
                       lights);
            VolPathIntegrator::Create
                      ((ParameterDictionary *)&stack0xfffffffffffffde8,(CameraHandle *)parameters,
                       (SamplerHandle *)
                       &local_120.
                        super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage,
                       (PrimitiveHandle *)
                       &local_120.
                        super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>.
                        _M_impl.super__Vector_impl_data._M_finish,&local_120,(FileLoc *)local_138);
            this->_vptr_Integrator = (_func_int **)in_stack_fffffffffffffde8.memoryResource;
            local_d8._0_8_ = local_138._0_8_;
            local_d8._16_8_ = local_138._16_8_;
          }
          else {
            iVar1 = std::__cxx11::string::compare((char *)name);
            if (iVar1 == 0) {
              local_140.bits =
                   (camera->
                   super_TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
                   ).bits;
              local_148.bits =
                   (sampler->
                   super_TaggedPointer<pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::RandomSampler,_pbrt::SobolSampler,_pbrt::StratifiedSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
                   ).bits;
              local_150.bits =
                   (aggregate->
                   super_TaggedPointer<pbrt::SimplePrimitive,_pbrt::GeometricPrimitive,_pbrt::TransformedPrimitive,_pbrt::AnimatedPrimitive,_pbrt::BVHAggregate,_pbrt::KdTreeAggregate>
                   ).bits;
              std::vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>::vector
                        ((vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> *)
                         (local_178 + 0x10),lights);
              BDPTIntegrator::Create
                        ((BDPTIntegrator *)&stack0xfffffffffffffde8,parameters,
                         (CameraHandle *)&local_140,(SamplerHandle *)&local_148,
                         (PrimitiveHandle *)&local_150,
                         (vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> *)
                         (local_178 + 0x10),loc);
              this->_vptr_Integrator = (_func_int **)in_stack_fffffffffffffde8.memoryResource;
              local_d8._0_8_ = local_178._16_8_;
              local_d8._16_8_ = local_158;
            }
            else {
              iVar1 = std::__cxx11::string::compare((char *)name);
              if (iVar1 == 0) {
                local_178._8_8_ =
                     (camera->
                     super_TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
                     ).bits;
                local_178._0_8_ =
                     (aggregate->
                     super_TaggedPointer<pbrt::SimplePrimitive,_pbrt::GeometricPrimitive,_pbrt::TransformedPrimitive,_pbrt::AnimatedPrimitive,_pbrt::BVHAggregate,_pbrt::KdTreeAggregate>
                     ).bits;
                std::vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>::vector
                          ((vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> *)
                           (local_198 + 8),lights);
                MLTIntegrator::Create
                          ((ParameterDictionary *)&stack0xfffffffffffffde8,
                           (CameraHandle *)parameters,(PrimitiveHandle *)(local_178 + 8),
                           (vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> *)
                           local_178,(FileLoc *)(local_198 + 8));
                this->_vptr_Integrator = (_func_int **)in_stack_fffffffffffffde8.memoryResource;
                local_d8._0_8_ = local_198._8_8_;
                local_d8._16_8_ = local_180.bits;
              }
              else {
                iVar1 = std::__cxx11::string::compare((char *)name);
                if (iVar1 == 0) {
                  local_198._0_8_ = (ulong)&colorSpace->illuminant | 0x2000000000000;
                  local_1a0.bits =
                       (camera->
                       super_TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
                       ).bits;
                  local_1b0._8_8_ =
                       (sampler->
                       super_TaggedPointer<pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::RandomSampler,_pbrt::SobolSampler,_pbrt::StratifiedSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
                       ).bits;
                  local_1b0._0_8_ =
                       (aggregate->
                       super_TaggedPointer<pbrt::SimplePrimitive,_pbrt::GeometricPrimitive,_pbrt::TransformedPrimitive,_pbrt::AnimatedPrimitive,_pbrt::BVHAggregate,_pbrt::KdTreeAggregate>
                       ).bits;
                  std::vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>::vector
                            (&local_48,lights);
                  lights_00.
                  super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>._M_impl.
                  super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffffde0;
                  lights_00.
                  super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>._M_impl.
                  super__Vector_impl_data._M_start = (pointer)&local_48;
                  lights_00.
                  super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage =
                       (pointer)in_stack_fffffffffffffde8.memoryResource;
                  AOIntegrator::Create
                            ((ParameterDictionary *)&stack0xfffffffffffffde8,
                             (SpectrumHandle *)parameters,(CameraHandle *)local_198,
                             (SamplerHandle *)&local_1a0,(PrimitiveHandle *)(local_1b0 + 8),
                             lights_00,(FileLoc *)local_1b0);
                  this->_vptr_Integrator = (_func_int **)in_stack_fffffffffffffde8.memoryResource;
                  local_d8._0_8_ =
                       local_48.
                       super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>.
                       _M_impl.super__Vector_impl_data._M_start;
                  local_d8._16_8_ =
                       local_48.
                       super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
                }
                else {
                  iVar1 = std::__cxx11::string::compare((char *)name);
                  if (iVar1 == 0) {
                    local_1c8.
                    super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage =
                         (pointer)(camera->
                                  super_TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
                                  ).bits;
                    local_1c8.
                    super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>.
                    _M_impl.super__Vector_impl_data._M_finish =
                         (pointer)(sampler->
                                  super_TaggedPointer<pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::RandomSampler,_pbrt::SobolSampler,_pbrt::StratifiedSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
                                  ).bits;
                    local_1c8.
                    super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>.
                    _M_impl.super__Vector_impl_data._M_start =
                         (pointer)(aggregate->
                                  super_TaggedPointer<pbrt::SimplePrimitive,_pbrt::GeometricPrimitive,_pbrt::TransformedPrimitive,_pbrt::AnimatedPrimitive,_pbrt::BVHAggregate,_pbrt::KdTreeAggregate>
                                  ).bits;
                    std::vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>::vector
                              ((vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> *)
                               &local_1e0,lights);
                    RandomWalkIntegrator::Create
                              ((ParameterDictionary *)&stack0xfffffffffffffde8,
                               (CameraHandle *)parameters,
                               (SamplerHandle *)
                               &local_1c8.
                                super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage,
                               (PrimitiveHandle *)
                               &local_1c8.
                                super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>
                                ._M_impl.super__Vector_impl_data._M_finish,&local_1c8,&local_1e0);
                    this->_vptr_Integrator = (_func_int **)in_stack_fffffffffffffde8.memoryResource;
                    local_d8._0_8_ = local_1e0.filename._M_len;
                    local_d8._16_8_ = local_1e0._16_8_;
                  }
                  else {
                    iVar1 = std::__cxx11::string::compare((char *)name);
                    if (iVar1 != 0) {
                      fmt = "%s: integrator type unknown.";
                      goto LAB_00447f3e;
                    }
                    local_1e8.
                    super_TaggedPointer<pbrt::SimplePrimitive,_pbrt::GeometricPrimitive,_pbrt::TransformedPrimitive,_pbrt::AnimatedPrimitive,_pbrt::BVHAggregate,_pbrt::KdTreeAggregate>
                    .bits = (TaggedPointer<pbrt::SimplePrimitive,_pbrt::GeometricPrimitive,_pbrt::TransformedPrimitive,_pbrt::AnimatedPrimitive,_pbrt::BVHAggregate,_pbrt::KdTreeAggregate>
                             )(camera->
                              super_TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
                              ).bits;
                    local_208._24_8_ =
                         (aggregate->
                         super_TaggedPointer<pbrt::SimplePrimitive,_pbrt::GeometricPrimitive,_pbrt::TransformedPrimitive,_pbrt::AnimatedPrimitive,_pbrt::BVHAggregate,_pbrt::KdTreeAggregate>
                         ).bits;
                    std::vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>::vector
                              ((vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> *)
                               local_208,lights);
                    SPPMIntegrator::Create
                              ((ParameterDictionary *)&stack0xfffffffffffffde8,
                               (RGBColorSpace *)parameters,(CameraHandle *)colorSpace,&local_1e8,
                               (vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> *)
                               (local_208 + 0x18),(FileLoc *)local_208);
                    this->_vptr_Integrator = (_func_int **)in_stack_fffffffffffffde8.memoryResource;
                    local_d8._0_8_ = local_208._0_8_;
                    local_d8._16_8_ = local_208._16_8_;
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  if ((ParsedParameter *)local_d8._0_8_ != (ParsedParameter *)0x0) {
    operator_delete((void *)local_d8._0_8_,local_d8._16_8_ - local_d8._0_8_);
  }
  if (in_stack_fffffffffffffde8.memoryResource != (memory_resource *)0x0) {
    ParameterDictionary::ReportUnused(parameters);
    return (__uniq_ptr_data<pbrt::Integrator,_std::default_delete<pbrt::Integrator>,_true,_true>)
           (__uniq_ptr_data<pbrt::Integrator,_std::default_delete<pbrt::Integrator>,_true,_true>)
           this;
  }
  fmt = "%s: unable to create integrator.";
LAB_00447f3e:
  ErrorExit<std::__cxx11::string_const&>(loc,fmt,name);
}

Assistant:

std::unique_ptr<Integrator> Integrator::Create(
    const std::string &name, const ParameterDictionary &parameters, CameraHandle camera,
    SamplerHandle sampler, PrimitiveHandle aggregate, std::vector<LightHandle> lights,
    const RGBColorSpace *colorSpace, const FileLoc *loc) {
    std::unique_ptr<Integrator> integrator;
    if (name == "path")
        integrator =
            PathIntegrator::Create(parameters, camera, sampler, aggregate, lights, loc);
    else if (name == "simplepath")
        integrator = SimplePathIntegrator::Create(parameters, camera, sampler, aggregate,
                                                  lights, loc);
    else if (name == "lightpath")
        integrator = LightPathIntegrator::Create(parameters, camera, sampler, aggregate,
                                                 lights, loc);
    else if (name == "simplevolpath")
        integrator = SimpleVolPathIntegrator::Create(parameters, camera, sampler,
                                                     aggregate, lights, loc);
    else if (name == "volpath")
        integrator = VolPathIntegrator::Create(parameters, camera, sampler, aggregate,
                                               lights, loc);
    else if (name == "bdpt")
        integrator =
            BDPTIntegrator::Create(parameters, camera, sampler, aggregate, lights, loc);
    else if (name == "mlt")
        integrator = MLTIntegrator::Create(parameters, camera, aggregate, lights, loc);
    else if (name == "ambientocclusion")
        integrator = AOIntegrator::Create(parameters, &colorSpace->illuminant, camera,
                                          sampler, aggregate, lights, loc);
    else if (name == "randomwalk")
        integrator = RandomWalkIntegrator::Create(parameters, camera, sampler, aggregate,
                                                  lights, loc);
    else if (name == "sppm")
        integrator = SPPMIntegrator::Create(parameters, colorSpace, camera, aggregate,
                                            lights, loc);
    else
        ErrorExit(loc, "%s: integrator type unknown.", name);

    if (!integrator)
        ErrorExit(loc, "%s: unable to create integrator.", name);

    parameters.ReportUnused();
    return integrator;
}